

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O2

AssertionResult * __thiscall
iuutil::
CmpHelperEqIterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (AssertionResult *__return_storage_ptr__,iuutil *this,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> b1,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> e1,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> b2,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> e2)

{
  int *expected;
  iuutil *v;
  bool bVar1;
  undefined8 extraout_RAX;
  iuStreamMessage *piVar2;
  AssertionResult *rhs;
  AssertionResult *this_00;
  long lVar3;
  Message ar;
  int local_240;
  uint local_23c;
  AssertionResult *local_238;
  int *local_230;
  int *local_228;
  AssertionResult local_220;
  long local_1f8;
  iuutil *local_1f0;
  iuutil *local_1e8;
  AssertionResult local_1e0;
  iuStreamMessage local_1b8;
  
  local_238 = __return_storage_ptr__;
  local_230 = b2._M_current;
  local_228 = e1._M_current;
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1b8.m_stream);
  local_1f8 = (long)b1._M_current - (long)this;
  local_23c = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  lVar3 = 0;
  local_240 = 0;
  local_1f0 = this;
  local_1e8 = (iuutil *)b1._M_current;
  while( true ) {
    expected = (int *)((long)local_228 + lVar3);
    v = local_1f0 + lVar3;
    if (v == local_1e8) break;
    if (expected == local_230) {
      local_220.m_message._M_dataplus._M_p._0_4_ =
           local_240 + (int)((ulong)(local_1f8 - lVar3) >> 2);
      piVar2 = iutest::detail::iuStreamMessage::operator<<
                         (&local_1b8,(char (*) [21])"\nMismatch element : ");
      piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,(int *)&local_220);
      piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,(char (*) [5])" vs ");
      iutest::detail::iuStreamMessage::operator<<(piVar2,&local_240);
      goto LAB_00167862;
    }
    iutest::internal::CmpHelperEQ<int,int>
              (&local_1e0,(internal *)0x16f26a,"",(char *)v,expected,e2._M_current);
    iutest::AssertionResult::operator!(&local_220,&local_1e0);
    bVar1 = local_220.m_result;
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1e0);
    if (bVar1 == true) {
      piVar2 = iutest::detail::iuStreamMessage::operator<<
                         (&local_1b8,(char (*) [25])"\nMismatch in a position ");
      piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,&local_240);
      piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,(char (*) [3])0x16cec8);
      iutest::PrintToString<int>(&local_220.m_message,(int *)v);
      piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,&local_220.m_message);
      piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,(char (*) [5])" vs ");
      iutest::PrintToString<int>(&local_1e0.m_message,expected);
      iutest::detail::iuStreamMessage::operator<<(piVar2,&local_1e0.m_message);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_220);
      local_23c = 0;
    }
    local_240 = local_240 + 1;
    lVar3 = lVar3 + 4;
  }
  if (expected == local_230) {
    if ((local_23c & 1) != 0) {
      (local_238->m_message)._M_dataplus._M_p = (pointer)&(local_238->m_message).field_2;
      (local_238->m_message)._M_string_length = 0;
      (local_238->m_message).field_2._M_local_buf[0] = '\0';
      local_238->m_result = true;
      this_00 = local_238;
      goto LAB_0016789e;
    }
  }
  else {
    local_220.m_message._M_dataplus._M_p._0_4_ =
         (int)((ulong)((long)local_230 + (-lVar3 - (long)local_228)) >> 2) + local_240;
    piVar2 = iutest::detail::iuStreamMessage::operator<<
                       (&local_1b8,(char (*) [21])"\nMismatch element : ");
    piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,&local_240);
    piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,(char (*) [5])" vs ");
    iutest::detail::iuStreamMessage::operator<<(piVar2,(int *)&local_220);
  }
LAB_00167862:
  this_00 = local_238;
  local_220.m_message._M_dataplus._M_p = (pointer)&local_220.m_message.field_2;
  local_220.m_message._M_string_length = 0;
  local_220.m_message.field_2._M_local_buf[0] = '\0';
  local_220.m_result = false;
  rhs = iutest::AssertionResult::operator<<(&local_220,&local_1b8);
  iutest::AssertionResult::AssertionResult(this_00,rhs);
  std::__cxx11::string::~string((string *)&local_220);
LAB_0016789e:
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1b8.m_stream);
  return this_00;
}

Assistant:

::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperEqIterator(T1 b1, T1 e1, T2 b2, T2 e2)
{
    int elem=0;
    bool result = true;
    ::iutest::Message ar;
    for(elem=0; b1 != e1 && b2 != e2; ++b1, ++b2, ++elem)
    {
        if(!::iutest::internal::backward::EqHelper<false>::Compare("", "", *b1, *b2))
        {
            result = false;
            ar << "\nMismatch in a position " << elem << ": "
                << ::iutest::internal::FormatForComparisonFailureMessage(*b1, *b2)
                << " vs " << ::iutest::internal::FormatForComparisonFailureMessage(*b2, *b1);
        }
    }
    if(b1 != e1)
    {
        int elem1 = elem;
        for(; b1 != e1; ++b1, ++elem1) {}
        result = false;
        ar << "\nMismatch element : " << elem1 << " vs " << elem;
    }
    if(b2 != e2)
    {
        int elem2 = elem;
        for(; b2 != e2; ++b2, ++elem2) {}
        result = false;
        ar << "\nMismatch element : " << elem << " vs " << elem2;
    }
    if( !result )
    {
        return ::iutest::AssertionFailure() << ar;
    }
    return ::iutest::AssertionSuccess();
}